

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O1

void __thiscall
Catch::CompactReporter::AssertionPrinter::printReconstructedExpression(AssertionPrinter *this)

{
  ostream *poVar1;
  pointer pcVar2;
  bool bVar3;
  IColourImpl *pIVar4;
  Colour colour;
  char *local_38;
  long local_30;
  char local_28 [16];
  
  bVar3 = AssertionResult::hasExpandedExpression(this->result);
  if (bVar3) {
    local_38 = (char *)((ulong)local_38 & 0xffffffffffffff00);
    pIVar4 = Colour::impl();
    (**(code **)(*(long *)pIVar4 + 0x10))(pIVar4,0x17);
    std::__ostream_insert<char,std::char_traits<char>>(this->stream," for: ",6);
    Colour::~Colour((Colour *)&local_38);
    poVar1 = this->stream;
    pcVar2 = (this->result->m_resultData).reconstructedExpression._M_dataplus._M_p;
    local_38 = local_28;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_38,pcVar2,
               pcVar2 + (this->result->m_resultData).reconstructedExpression._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,local_38,local_30);
    if (local_38 != local_28) {
      operator_delete(local_38);
    }
  }
  return;
}

Assistant:

void printReconstructedExpression() const {
                if( result.hasExpandedExpression() ) {
                    {
                        Colour colour( dimColour() );
                        stream << " for: ";
                    }
                    stream << result.getExpandedExpression();
                }
            }